

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *ridx,int *rn,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  bool bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  uint uVar4;
  fpclass_type fVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int32_t iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  undefined4 *puVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  undefined4 *puVar23;
  byte bVar24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_428 [32];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [13];
  undefined3 uStack_3bb;
  int iStack_3b8;
  bool bStack_3b4;
  undefined8 local_3b0;
  ulong local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  ulong local_390;
  int *local_388;
  pointer local_380;
  int *local_378;
  int *local_370;
  int *local_368;
  int *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  ulong local_350;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_348;
  ulong local_340;
  undefined1 local_338 [32];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [13];
  undefined3 uStack_2cb;
  int iStack_2c8;
  bool bStack_2c4;
  undefined8 local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  undefined8 local_240;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar24 = 0;
  local_2c0._0_4_ = cpp_dec_float_finite;
  local_2c0._4_4_ = 0x1c;
  local_338._0_16_ = (undefined1  [16])0x0;
  local_338._16_16_ = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = false;
  local_380 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_388 = (this->l).idx;
  local_360 = (this->l).row;
  local_378 = (this->l).start;
  local_340 = (ulong)(this->l).firstUpdate;
  local_398 = vec;
  local_370 = ridx;
  local_368 = rn;
  local_358 = eps;
  if ((long)local_340 < 1) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    local_348 = this;
    do {
      iVar11 = local_360[uVar16];
      pnVar20 = local_398 + iVar11;
      puVar21 = (uint *)local_338;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar21 = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar24 * -2 + 1) * 4);
        puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
      }
      iVar12 = local_398[iVar11].m_backend.exp;
      iStack_2c8 = iVar12;
      bVar1 = local_398[iVar11].m_backend.neg;
      bStack_2c4 = bVar1;
      fVar2 = local_398[iVar11].m_backend.fpclass;
      iVar3 = local_398[iVar11].m_backend.prec_elem;
      local_2c0._4_4_ = iVar3;
      local_2c0._0_4_ = fVar2;
      pnVar20 = local_398 + iVar11;
      puVar21 = (uint *)local_428;
      local_350 = uVar16;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar21 = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar24 * -2 + 1) * 4);
        puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
      }
      pnVar20 = local_358;
      pcVar18 = &local_b0;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar18->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar24 * -2 + 1) * 4);
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar24 * -2 + 1) * 4);
      }
      local_b0.exp = (local_358->m_backend).exp;
      local_b0.neg = (local_358->m_backend).neg;
      fVar5 = (local_358->m_backend).fpclass;
      iVar7 = (local_358->m_backend).prec_elem;
      local_b0.fpclass = fVar5;
      local_b0.prec_elem = iVar7;
      local_3b0._4_4_ = iVar3;
      local_3b0._0_4_ = fVar2;
      bStack_3b4 = bVar1;
      if ((bVar1 == true) && (local_428._0_4_ != 0 || fVar2 != cpp_dec_float_finite)) {
        bStack_3b4 = false;
      }
      if ((fVar5 != cpp_dec_float_NaN && fVar2 != cpp_dec_float_NaN) &&
         (iStack_3b8 = iVar12,
         iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_428,&local_b0), 0 < iVar11)) {
        local_3a0 = (ulong)local_378[local_350];
        iVar11 = local_378[local_350 + 1];
        if (local_378[local_350] < iVar11) {
          pcVar18 = &local_380[local_3a0].m_backend;
          piVar17 = local_388 + local_3a0;
          do {
            iVar12 = *piVar17;
            local_1c0._0_4_ = cpp_dec_float_finite;
            local_1c0._4_4_ = 0x1c;
            local_238 = (undefined1  [16])0x0;
            local_228 = (undefined1  [16])0x0;
            local_218 = (undefined1  [16])0x0;
            local_208 = (undefined1  [16])0x0;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8 = SUB1613((undefined1  [16])0x0,0);
            uStack_1cb = 0;
            iStack_1c8 = 0;
            bStack_1c4 = false;
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_338;
            if (pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_238) {
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_238;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar24 * -8 + 4)
                ;
              }
              iStack_1c8 = iStack_2c8;
              bStack_1c4 = bStack_2c4;
              local_1c0._0_4_ = (fpclass_type)local_2c0;
              local_1c0._4_4_ = local_2c0._4_4_;
              pcVar22 = pcVar18;
            }
            local_390 = CONCAT44(local_390._4_4_,iVar12);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_238,pcVar22);
            pcVar22 = &local_398[iVar12].m_backend;
            if (local_398[iVar12].m_backend.fpclass != cpp_dec_float_NaN) {
              local_3b0._0_4_ = cpp_dec_float_finite;
              local_3b0._4_4_ = 0x1c;
              local_428._0_16_ = (undefined1  [16])0x0;
              local_428._16_16_ = (undefined1  [16])0x0;
              local_408 = (undefined1  [16])0x0;
              local_3f8 = (undefined1  [16])0x0;
              local_3e8 = (undefined1  [16])0x0;
              local_3d8 = (undefined1  [16])0x0;
              local_3c8 = SUB1613((undefined1  [16])0x0,0);
              uStack_3bb = 0;
              iStack_3b8 = 0;
              bStack_3b4 = false;
              pcVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
              pcVar14 = pcVar13;
              puVar21 = (uint *)local_428;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                *puVar21 = (pcVar14->data)._M_elems[0];
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar24 * -8 + 4)
                ;
                puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
              }
              iStack_3b8 = pcVar13->exp;
              bStack_3b4 = pcVar13->neg;
              local_3b0._0_4_ = pcVar13->fpclass;
              local_3b0._4_4_ = pcVar13->prec_elem;
              iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (pcVar22,(cpp_dec_float<200U,_int,_void> *)local_428);
              if (iVar12 == 0) {
                local_370[*local_368] = (int)local_390;
                *local_368 = *local_368 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (pcVar22,(cpp_dec_float<200U,_int,_void> *)local_238);
            if (pcVar22->fpclass != cpp_dec_float_NaN) {
              local_3b0._0_4_ = cpp_dec_float_finite;
              local_3b0._4_4_ = 0x1c;
              local_428._0_16_ = (undefined1  [16])0x0;
              local_428._16_16_ = (undefined1  [16])0x0;
              local_408 = (undefined1  [16])0x0;
              local_3f8 = (undefined1  [16])0x0;
              local_3e8 = (undefined1  [16])0x0;
              local_3d8 = (undefined1  [16])0x0;
              local_3c8 = SUB1613((undefined1  [16])0x0,0);
              uStack_3bb = 0;
              iStack_3b8 = 0;
              bStack_3b4 = false;
              pcVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
              pcVar14 = pcVar13;
              puVar21 = (uint *)local_428;
              for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                *puVar21 = (pcVar14->data)._M_elems[0];
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar24 * -8 + 4)
                ;
                puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
              }
              iStack_3b8 = pcVar13->exp;
              bStack_3b4 = pcVar13->neg;
              local_3b0._0_4_ = pcVar13->fpclass;
              local_3b0._4_4_ = pcVar13->prec_elem;
              iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (pcVar22,(cpp_dec_float<200U,_int,_void> *)local_428);
              if (iVar12 == 0) {
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)pcVar22,1e-100);
              }
            }
            piVar17 = piVar17 + 1;
            pcVar18 = pcVar18 + 1;
            iVar11 = iVar11 + -1;
          } while ((int)local_3a0 < iVar11);
        }
      }
      uVar16 = local_350 + 1;
      this = local_348;
    } while (uVar16 != local_340);
  }
  if (((this->l).updateType != 0) &&
     (uVar4 = (this->l).firstUnused, local_3a0 = (ulong)uVar4, (int)uVar16 < (int)uVar4)) {
    local_390 = uVar16 & 0xffffffff;
    do {
      iVar11 = local_378[local_390];
      local_240._0_4_ = cpp_dec_float_finite;
      local_240._4_4_ = 0x1c;
      local_2b8._0_16_ = (undefined1  [16])0x0;
      local_2b8._16_16_ = (undefined1  [16])0x0;
      local_298 = (undefined1  [16])0x0;
      local_288 = (undefined1  [16])0x0;
      local_278 = (undefined1  [16])0x0;
      local_268 = (undefined1  [16])0x0;
      local_258 = SUB1613((undefined1  [16])0x0,0);
      uStack_24b = 0;
      iStack_248 = 0;
      bStack_244 = false;
      iVar12 = local_378[local_390 + 1];
      if (iVar11 < iVar12) {
        pcVar18 = &local_380[iVar11].m_backend;
        piVar17 = local_388 + iVar11;
        do {
          pcVar14 = &local_398[*piVar17].m_backend;
          local_3b0._0_4_ = cpp_dec_float_finite;
          local_3b0._4_4_ = 0x1c;
          local_428._0_16_ = (undefined1  [16])0x0;
          local_428._16_16_ = (undefined1  [16])0x0;
          local_408 = (undefined1  [16])0x0;
          local_3f8 = (undefined1  [16])0x0;
          local_3e8 = (undefined1  [16])0x0;
          local_3d8 = (undefined1  [16])0x0;
          local_3c8 = SUB1613((undefined1  [16])0x0,0);
          uStack_3bb = 0;
          iStack_3b8 = 0;
          bStack_3b4 = false;
          pcVar22 = pcVar14;
          if ((pcVar18 != (cpp_dec_float<200U,_int,_void> *)local_428) &&
             (pcVar22 = pcVar18, (cpp_dec_float<200U,_int,_void> *)local_428 != pcVar14)) {
            pcVar13 = pcVar14;
            puVar21 = (uint *)local_428;
            for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar21 = (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar24 * -8 + 4);
              puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
            }
            iStack_3b8 = pcVar14->exp;
            bStack_3b4 = pcVar14->neg;
            local_3b0._0_4_ = pcVar14->fpclass;
            local_3b0._4_4_ = pcVar14->prec_elem;
          }
          piVar17 = piVar17 + 1;
          pcVar18 = pcVar18 + 1;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_428,pcVar22);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                     (cpp_dec_float<200U,_int,_void> *)local_428);
          iVar12 = iVar12 + -1;
        } while (iVar11 < iVar12);
      }
      uVar16 = local_390;
      iVar11 = local_360[local_390];
      puVar19 = (undefined4 *)local_2b8;
      puVar23 = (undefined4 *)local_338;
      for (lVar15 = 0x1c; uVar9 = local_240, bVar1 = bStack_244, iVar12 = iStack_248, lVar15 != 0;
          lVar15 = lVar15 + -1) {
        *puVar23 = *puVar19;
        puVar19 = puVar19 + (ulong)bVar24 * -2 + 1;
        puVar23 = puVar23 + (ulong)bVar24 * -2 + 1;
      }
      fVar2 = (fpclass_type)local_240;
      iStack_2c8 = iStack_248;
      bStack_2c4 = bStack_244;
      local_2c0._0_4_ = (fpclass_type)local_240;
      local_2c0._4_4_ = local_240._4_4_;
      puVar19 = (undefined4 *)local_2b8;
      puVar23 = (undefined4 *)local_428;
      for (lVar15 = 0x1c; uVar10 = local_240, lVar15 != 0; lVar15 = lVar15 + -1) {
        *puVar23 = *puVar19;
        puVar19 = puVar19 + (ulong)bVar24 * -2 + 1;
        puVar23 = puVar23 + (ulong)bVar24 * -2 + 1;
      }
      pnVar20 = local_358;
      pcVar18 = &local_130;
      for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pcVar18->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar24 * -2 + 1) * 4);
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar24 * -2 + 1) * 4);
      }
      local_130.exp = (local_358->m_backend).exp;
      local_130.neg = (local_358->m_backend).neg;
      fVar6 = (local_358->m_backend).fpclass;
      iVar8 = (local_358->m_backend).prec_elem;
      iStack_3b8 = iVar12;
      bStack_3b4 = bVar1;
      local_240._0_4_ = (fpclass_type)uVar9;
      local_240._4_4_ = SUB84(uVar9,4);
      local_3b0._0_4_ = (fpclass_type)local_240;
      local_3b0._4_4_ = local_240._4_4_;
      local_130.fpclass = fVar6;
      local_130.prec_elem = iVar8;
      if ((bVar1 == true) && (local_428._0_4_ != 0 || fVar2 != cpp_dec_float_finite)) {
        bStack_3b4 = false;
      }
      if ((fVar6 != cpp_dec_float_NaN && fVar2 != cpp_dec_float_NaN) &&
         (local_240 = uVar10,
         iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_428,&local_130), 0 < iVar12)) {
        puVar21 = (uint *)local_338;
        pcVar18 = &local_1b0;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar18->data)._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar24 * -2 + 1) * 4)
          ;
        }
        local_1b0.exp = iStack_2c8;
        local_1b0.neg = bStack_2c4;
        local_1b0.fpclass = (fpclass_type)local_2c0;
        local_1b0.prec_elem = local_2c0._4_4_;
        pcVar18 = &local_398[iVar11].m_backend;
        if (local_398[iVar11].m_backend.fpclass != cpp_dec_float_NaN) {
          local_3b0._0_4_ = cpp_dec_float_finite;
          local_3b0._4_4_ = 0x1c;
          local_428._0_16_ = (undefined1  [16])0x0;
          local_428._16_16_ = (undefined1  [16])0x0;
          local_408 = (undefined1  [16])0x0;
          local_3f8 = (undefined1  [16])0x0;
          local_3e8 = (undefined1  [16])0x0;
          local_3d8 = (undefined1  [16])0x0;
          local_3c8 = SUB1613((undefined1  [16])0x0,0);
          uStack_3bb = 0;
          iStack_3b8 = 0;
          bStack_3b4 = false;
          pcVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
          pcVar22 = pcVar14;
          puVar21 = (uint *)local_428;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar21 = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar24 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
          }
          iStack_3b8 = pcVar14->exp;
          bStack_3b4 = pcVar14->neg;
          local_3b0._0_4_ = pcVar14->fpclass;
          local_3b0._4_4_ = pcVar14->prec_elem;
          iVar12 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (pcVar18,(cpp_dec_float<200U,_int,_void> *)local_428);
          if (iVar12 == 0) {
            local_370[*local_368] = iVar11;
            *local_368 = *local_368 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (pcVar18,&local_1b0);
        if (pcVar18->fpclass != cpp_dec_float_NaN) {
          local_3b0._0_4_ = cpp_dec_float_finite;
          local_3b0._4_4_ = 0x1c;
          local_428._0_16_ = (undefined1  [16])0x0;
          local_428._16_16_ = (undefined1  [16])0x0;
          local_408 = (undefined1  [16])0x0;
          local_3f8 = (undefined1  [16])0x0;
          local_3e8 = (undefined1  [16])0x0;
          local_3d8 = (undefined1  [16])0x0;
          local_3c8 = SUB1613((undefined1  [16])0x0,0);
          uStack_3bb = 0;
          iStack_3b8 = 0;
          bStack_3b4 = false;
          pcVar14 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
          pcVar22 = pcVar14;
          puVar21 = (uint *)local_428;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar21 = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar24 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
          }
          iStack_3b8 = pcVar14->exp;
          bStack_3b4 = pcVar14->neg;
          local_3b0._0_4_ = pcVar14->fpclass;
          local_3b0._4_4_ = pcVar14->prec_elem;
          iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (pcVar18,(cpp_dec_float<200U,_int,_void> *)local_428);
          if (iVar11 == 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)pcVar18,1e-100);
          }
        }
      }
      local_390 = uVar16 + 1;
    } while (local_390 != local_3a0);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright(R* vec, int* ridx, int& rn, R eps)
{
   int i, j, k, n;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      x = vec[lrow[i]];

      // check whether there is a corresponding value in the rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // apply \f$- x * L_{k,i}\f$ to all corresponding values in rhs/solution VectorBase<R>
         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp += vec[*idx++] * (*val++);
         }

         j = lrow[i];
         x = R(tmp);

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);
      }
   }
}